

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O1

void __thiscall
Assimp::RemoveRedundantMatsProcess::Execute(RemoveRedundantMatsProcess *this,aiScene *pScene)

{
  aiMaterial *paVar1;
  aiMesh *paVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  aiReturn aVar6;
  Logger *pLVar7;
  ulong uVar8;
  size_t sVar9;
  void *__s;
  void *pvVar10;
  aiMaterial **__s_00;
  long lVar11;
  ulong uVar12;
  _List_node_base *p_Var13;
  difference_type __n;
  vector<bool,_std::allocator<bool>_> abReferenced;
  int dummy;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  aiString name;
  uint local_630;
  int local_62c;
  vector<bool,_std::allocator<bool>_> local_620;
  undefined4 local_5f4;
  void *local_5f0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  long *local_5d0;
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [12];
  ios_base local_540 [264];
  aiString local_438;
  
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"RemoveRedundantMatsProcess begin");
  if ((ulong)pScene->mNumMaterials == 0) {
    iVar3 = 0;
    local_62c = 0;
  }
  else {
    local_438.length = local_438.length & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_620,(ulong)pScene->mNumMaterials,(bool *)&local_438,
               (allocator_type *)local_5b0);
    if (pScene->mNumMeshes != 0) {
      uVar8 = 0;
      do {
        uVar5 = pScene->mMeshes[uVar8]->mMaterialIndex;
        local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
             local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
        uVar8 = uVar8 + 1;
      } while (uVar8 < pScene->mNumMeshes);
    }
    if ((this->mConfigFixedMaterials)._M_string_length != 0) {
      local_5e8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_5e8;
      local_5e8._M_impl._M_node._M_size = 0;
      local_5e8._M_impl._M_node.super__List_node_base._M_prev =
           local_5e8._M_impl._M_node.super__List_node_base._M_next;
      ConvertListToStrings
                (&this->mConfigFixedMaterials,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5e8._M_impl._M_node.super__List_node_base._M_next);
      if (pScene->mNumMaterials != 0) {
        uVar8 = 0;
        do {
          paVar1 = pScene->mMaterials[uVar8];
          local_438.length = 0;
          local_438.data[0] = '\0';
          memset(local_438.data + 1,0x1b,0x3ff);
          aiGetMaterialString(paVar1,"?mat.name",0,0,&local_438);
          p_Var13 = local_5e8._M_impl._M_node.super__List_node_base._M_next;
          if (local_438.length != 0) {
            while ((p_Var13 != (_List_node_base *)&local_5e8 &&
                   (iVar3 = std::__cxx11::string::compare((char *)(p_Var13 + 1)), iVar3 != 0))) {
              p_Var13 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            }
            if (p_Var13 != (_List_node_base *)&local_5e8) {
              local_5f4 = 1;
              aiMaterial::AddBinaryProperty
                        (paVar1,&local_5f4,4,"~RRM.UniqueMaterial",0,0,aiPTI_Integer);
              local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] =
                   local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] |
                   1L << ((byte)uVar8 & 0x3f);
              pLVar7 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[42]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b0,(char (*) [42])"Found positive match in exclusion list: \'");
              sVar9 = strlen(local_438.data);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b0,local_438.data,sVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"\'",1);
              std::__cxx11::stringbuf::str();
              Logger::debug(pLVar7,(char *)local_5d0);
              if (local_5d0 != local_5c0) {
                operator_delete(local_5d0,local_5c0[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
              std::ios_base::~ios_base(local_540);
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < pScene->mNumMaterials);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_5e8);
    }
    uVar5 = pScene->mNumMaterials;
    uVar8 = (ulong)uVar5 * 4;
    __s = operator_new__(uVar8);
    if ((ulong)uVar5 != 0) {
      memset(__s,0,uVar8);
    }
    pvVar10 = operator_new__(uVar8);
    if (pScene->mNumMaterials == 0) {
      iVar3 = 0;
      local_62c = 0;
      local_630 = 0;
      uVar5 = 0;
    }
    else {
      uVar8 = 0;
      local_630 = 0;
      local_62c = 0;
      iVar3 = 0;
      do {
        if ((local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          paVar1 = pScene->mMaterials[uVar8];
          if (paVar1 != (aiMaterial *)0x0) {
            aiMaterial::~aiMaterial(paVar1);
            operator_delete(paVar1,0x10);
          }
          iVar3 = iVar3 + 1;
LAB_003dcbd1:
          pScene->mMaterials[uVar8] = (aiMaterial *)0x0;
        }
        else {
          uVar4 = ComputeMaterialHash(pScene->mMaterials[uVar8],false);
          *(uint32_t *)((long)pvVar10 + uVar8 * 4) = uVar4;
          if (uVar8 != 0) {
            uVar12 = 0;
            do {
              if (((local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >>
                    (uVar12 & 0x3f) & 1) != 0) &&
                 (uVar4 == *(uint32_t *)((long)pvVar10 + uVar12 * 4))) {
                *(undefined4 *)((long)__s + uVar8 * 4) = *(undefined4 *)((long)__s + uVar12 * 4);
                paVar1 = pScene->mMaterials[uVar8];
                if (paVar1 != (aiMaterial *)0x0) {
                  aiMaterial::~aiMaterial(paVar1);
                  operator_delete(paVar1,0x10);
                }
                local_62c = local_62c + 1;
                goto LAB_003dcbd1;
              }
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          if (uVar4 != 0) {
            *(uint *)((long)__s + uVar8 * 4) = local_630;
            local_630 = local_630 + 1;
          }
        }
        uVar8 = uVar8 + 1;
        uVar5 = pScene->mNumMaterials;
      } while (uVar8 < uVar5);
    }
    if (local_630 != uVar5) {
      if (local_630 == 0) {
        __assert_fail("iNewNum > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                      ,0xaf,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)");
      }
      __s_00 = (aiMaterial **)operator_new__((ulong)local_630 << 3);
      memset(__s_00,0,(ulong)local_630 << 3);
      if (pScene->mNumMaterials != 0) {
        uVar8 = 0;
        local_5f0 = __s;
        do {
          if ((local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
            uVar5 = *(uint *)((long)__s + uVar8 * 4);
            paVar1 = __s_00[uVar5];
            if (paVar1 == (aiMaterial *)0x0) {
              __s_00[uVar5] = pScene->mMaterials[uVar8];
              __s = local_5f0;
            }
            else {
              local_438.length = 0;
              local_438.data[0] = '\0';
              memset(local_438.data + 1,0x1b,0x3ff);
              aVar6 = aiGetMaterialString(paVar1,"?mat.name",0,0,&local_438);
              __s = local_5f0;
              if (aVar6 != aiReturn_SUCCESS) {
                local_438.length = snprintf(local_438.data,0x400,"JoinedMaterial_#%u");
                aiMaterial::AddProperty(__s_00[uVar5],&local_438,"?mat.name",0,0);
                __s = local_5f0;
              }
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < pScene->mNumMaterials);
      }
      if (pScene->mNumMeshes != 0) {
        lVar11 = 0;
        do {
          paVar2 = pScene->mMeshes[lVar11];
          if (paVar2 == (aiMesh *)0x0) {
            __assert_fail("__null!=mesh",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                          ,200,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)"
                         );
          }
          paVar2->mMaterialIndex = *(uint *)((long)__s + (ulong)paVar2->mMaterialIndex * 4);
          lVar11 = lVar11 + 1;
        } while ((uint)lVar11 < pScene->mNumMeshes);
      }
      if (pScene->mMaterials != (aiMaterial **)0x0) {
        operator_delete__(pScene->mMaterials);
      }
      pScene->mMaterials = __s_00;
      pScene->mNumMaterials = local_630;
    }
    operator_delete__(pvVar10);
    operator_delete__(__s);
    if (local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_620.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  pLVar7 = DefaultLogger::get();
  if (local_62c == 0 && iVar3 == 0) {
    Logger::debug(pLVar7,"RemoveRedundantMatsProcess finished ");
  }
  else {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438,
               (char (*) [46])"RemoveRedundantMatsProcess finished. Removed ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438," redundant and ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_438," unused materials.",0x12);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar7,(char *)local_5b0[0]);
    if (local_5b0[0] != local_5a0) {
      operator_delete(local_5b0[0],local_5a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
    std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
  }
  return;
}

Assistant:

void RemoveRedundantMatsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess begin");

    unsigned int redundantRemoved = 0, unreferencedRemoved = 0;
    if (pScene->mNumMaterials)
    {
        // Find out which materials are referenced by meshes
        std::vector<bool> abReferenced(pScene->mNumMaterials,false);
        for (unsigned int i = 0;i < pScene->mNumMeshes;++i)
            abReferenced[pScene->mMeshes[i]->mMaterialIndex] = true;

        // If a list of materials to be excluded was given, match the list with
        // our imported materials and 'salt' all positive matches to ensure that
        // we get unique hashes later.
        if (mConfigFixedMaterials.length()) {

            std::list<std::string> strings;
            ConvertListToStrings(mConfigFixedMaterials,strings);

            for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
                aiMaterial* mat = pScene->mMaterials[i];

                aiString name;
                mat->Get(AI_MATKEY_NAME,name);

                if (name.length) {
                    std::list<std::string>::const_iterator it = std::find(strings.begin(), strings.end(), name.data);
                    if (it != strings.end()) {

                        // Our brilliant 'salt': A single material property with ~ as first
                        // character to mark it as internal and temporary.
                        const int dummy = 1;
                        ((aiMaterial*)mat)->AddProperty(&dummy,1,"~RRM.UniqueMaterial",0,0);

                        // Keep this material even if no mesh references it
                        abReferenced[i] = true;
                        ASSIMP_LOG_DEBUG_F( "Found positive match in exclusion list: \'", name.data, "\'");
                    }
                }
            }
        }

        // TODO: re-implement this algorithm to work in-place
        unsigned int *aiMappingTable = new unsigned int[pScene->mNumMaterials];
        for ( unsigned int i=0; i<pScene->mNumMaterials; i++ ) {
            aiMappingTable[ i ] = 0;
        }
        unsigned int iNewNum = 0;

        // Iterate through all materials and calculate a hash for them
        // store all hashes in a list and so a quick search whether
        // we do already have a specific hash. This allows us to
        // determine which materials are identical.
        uint32_t *aiHashes = new uint32_t[ pScene->mNumMaterials ];;
        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        {
            // No mesh is referencing this material, remove it.
            if (!abReferenced[i]) {
                ++unreferencedRemoved;
                delete pScene->mMaterials[i];
                pScene->mMaterials[i] = nullptr;
                continue;
            }

            // Check all previously mapped materials for a matching hash.
            // On a match we can delete this material and just make it ref to the same index.
            uint32_t me = aiHashes[i] = ComputeMaterialHash(pScene->mMaterials[i]);
            for (unsigned int a = 0; a < i;++a)
            {
                if (abReferenced[a] && me == aiHashes[a]) {
                    ++redundantRemoved;
                    me = 0;
                    aiMappingTable[i] = aiMappingTable[a];
                    delete pScene->mMaterials[i];
                    pScene->mMaterials[i] = nullptr;
                    break;
                }
            }
            // This is a new material that is referenced, add to the map.
            if (me) {
                aiMappingTable[i] = iNewNum++;
            }
        }
        // If the new material count differs from the original,
        // we need to rebuild the material list and remap mesh material indexes.
        if (iNewNum != pScene->mNumMaterials) {
            ai_assert(iNewNum > 0);
            aiMaterial** ppcMaterials = new aiMaterial*[iNewNum];
            ::memset(ppcMaterials,0,sizeof(void*)*iNewNum);
            for (unsigned int p = 0; p < pScene->mNumMaterials;++p)
            {
                // if the material is not referenced ... remove it
                if (!abReferenced[p]) {
                    continue;
                }

                // generate new names for modified materials that had no names
                const unsigned int idx = aiMappingTable[p];
                if (ppcMaterials[idx]) {
                    aiString sz;
                    if( ppcMaterials[idx]->Get(AI_MATKEY_NAME, sz) != AI_SUCCESS ) {
                        sz.length = ::ai_snprintf(sz.data,MAXLEN,"JoinedMaterial_#%u",p);
                        ((aiMaterial*)ppcMaterials[idx])->AddProperty(&sz,AI_MATKEY_NAME);
                    }
                } else {
                    ppcMaterials[idx] = pScene->mMaterials[p];
                }
            }
            // update all material indices
            for (unsigned int p = 0; p < pScene->mNumMeshes;++p) {
                aiMesh* mesh = pScene->mMeshes[p];
                ai_assert( NULL!=mesh );
                mesh->mMaterialIndex = aiMappingTable[mesh->mMaterialIndex];
            }
            // delete the old material list
            delete[] pScene->mMaterials;
            pScene->mMaterials = ppcMaterials;
            pScene->mNumMaterials = iNewNum;
        }
        // delete temporary storage
        delete[] aiHashes;
        delete[] aiMappingTable;
    }
    if (redundantRemoved == 0 && unreferencedRemoved == 0)
    {
        ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess finished ");
    }
    else
    {
        ASSIMP_LOG_INFO_F("RemoveRedundantMatsProcess finished. Removed ", redundantRemoved, " redundant and ", 
            unreferencedRemoved, " unused materials.");
    }
}